

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O3

MPP_RET add_empty_nalu(H264dCurStream_t *p_strm)

{
  RK_U8 *pRVar1;
  MPP_RET MVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = p_strm->head_offset;
  uVar4 = uVar3 + 8;
  if (p_strm->head_max_size <= uVar4) {
    MVar2 = realloc_buffer(&p_strm->head_buf,&p_strm->head_max_size,0x200);
    if (MVar2 < MPP_OK) {
      if (((byte)h264d_debug & 4) == 0) {
        return MVar2;
      }
      _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x148);
      return MVar2;
    }
    uVar3 = p_strm->head_offset;
    uVar4 = uVar3 + 8;
  }
  pRVar1 = p_strm->head_buf + uVar3;
  pRVar1[0] = '\x01';
  pRVar1[1] = '\0';
  pRVar1[2] = '\0';
  pRVar1[3] = '\0';
  pRVar1[4] = '\0';
  pRVar1[5] = '\0';
  pRVar1[6] = '\0';
  pRVar1[7] = '\0';
  p_strm->head_offset = uVar4;
  return MPP_OK;
}

Assistant:

static MPP_RET add_empty_nalu(H264dCurStream_t *p_strm)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_U8  *p_des = NULL;
    RK_U32 add_size = sizeof(H264dNaluHead_t);

    if ((p_strm->head_offset + add_size) >= p_strm->head_max_size) {
        FUN_CHECK(ret = realloc_buffer(&p_strm->head_buf, &p_strm->head_max_size, HEAD_BUF_ADD_SIZE));
    }
    p_des = &p_strm->head_buf[p_strm->head_offset];
    ((H264dNaluHead_t *)p_des)->is_frame_end  = 1;
    ((H264dNaluHead_t *)p_des)->nalu_type = 0;
    ((H264dNaluHead_t *)p_des)->sodb_len = 0;
    p_strm->head_offset += add_size;

    return ret = MPP_OK;
__FAILED:
    return ret;
}